

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O0

void __thiscall
HighsImplications::cleanupVlb
          (HighsImplications *this,HighsInt col,HighsInt vlbCol,VarBound *vlb,double lb,
          bool *redundant,bool *infeasible,bool allowBoundChanges)

{
  bool bVar1;
  pointer pHVar2;
  double *in_RCX;
  int in_EDX;
  HighsInt in_ESI;
  undefined1 *in_R8;
  undefined1 *in_R9;
  Reason in_XMM0_Qa;
  double dVar3;
  byte in_stack_00000008;
  double newcoef;
  HighsCDouble minlb;
  HighsCDouble maxlb;
  double in_stack_ffffffffffffff48;
  HighsCDouble *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  double in_stack_ffffffffffffff60;
  VarBound *in_stack_ffffffffffffff70;
  Reason reason;
  HighsCDouble local_70;
  double local_60;
  HighsCDouble local_58;
  HighsCDouble local_48;
  byte local_31;
  undefined1 *local_30;
  undefined1 *local_28;
  Reason local_20;
  double *local_18;
  HighsInt local_10;
  HighsInt local_c;
  
  local_31 = in_stack_00000008 & 1;
  *in_R8 = 0;
  *in_R9 = 0;
  if (in_EDX != -1) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_XMM0_Qa;
    local_18 = in_RCX;
    local_10 = in_EDX;
    local_c = in_ESI;
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5ee895);
    HighsDebugSol::checkVlb
              ((HighsDebugSol *)&pHVar2->field_0x68b0,local_c,local_10,*local_18,local_18[1]);
    dVar3 = VarBound::maxValue(in_stack_ffffffffffffff70);
    HighsCDouble::HighsCDouble(&local_48,dVar3);
    dVar3 = VarBound::minValue(in_stack_ffffffffffffff70);
    HighsCDouble::HighsCDouble(&local_58,dVar3);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5ee91d)
    ;
    bVar1 = HighsCDouble::operator<=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (bVar1) {
      *local_28 = 1;
    }
    else {
      reason = local_20;
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ee96f);
      bVar1 = HighsCDouble::operator<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if (bVar1) {
        local_70 = ::operator-(in_stack_ffffffffffffff60,
                               (HighsCDouble *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_60 = HighsCDouble::operator_cast_to_double(&local_70);
        if (0.0 < *local_18 || *local_18 == 0.0) {
          *(Reason *)(local_18 + 1) = local_20;
          *local_18 = -local_60;
        }
        else {
          *local_18 = local_60;
        }
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5eea38);
        HighsDebugSol::checkVlb
                  ((HighsDebugSol *)&pHVar2->field_0x68b0,local_c,local_10,*local_18,local_18[1]);
      }
      else if ((local_31 & 1) != 0) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x5eeaa5);
        bVar1 = HighsCDouble::operator>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (bVar1) {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x5eeadb);
          dVar3 = HighsCDouble::operator_cast_to_double(&local_58);
          HighsDomain::Reason::unspecified();
          HighsDomain::changeBound
                    ((HighsDomain *)local_20,(HighsBoundType)((ulong)dVar3 >> 0x20),SUB84(dVar3,0),
                     (double)CONCAT44(local_c,in_stack_ffffffffffffff58),reason);
          pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x5eeb3b);
          bVar1 = HighsDomain::infeasible(&pHVar2->domain);
          *local_30 = bVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void HighsImplications::cleanupVlb(HighsInt col, HighsInt vlbCol,
                                   HighsImplications::VarBound& vlb, double lb,
                                   bool& redundant, bool& infeasible,
                                   bool allowBoundChanges) const {
  // initialize
  redundant = false;
  infeasible = false;

  // return if there is no variable bound
  if (vlbCol == -1) return;

  // check variable lower bound
  mipsolver.mipdata_->debugSolution.checkVlb(col, vlbCol, vlb.coef,
                                             vlb.constant);

  HighsCDouble maxlb = vlb.maxValue();
  HighsCDouble minlb = vlb.minValue();

  if (maxlb <= lb + mipsolver.mipdata_->feastol) {
    // variable bound is redundant
    redundant = true;
  } else if (minlb < lb - mipsolver.mipdata_->epsilon) {
    // coefficient can be tightened
    double newcoef = static_cast<double>(lb - maxlb);
    if (vlb.coef < 0) {
      vlb.coef = newcoef;
    } else {
      vlb.constant = lb;
      vlb.coef = -newcoef;
    }
    // check tightened variable lower bound
    mipsolver.mipdata_->debugSolution.checkVlb(col, vlbCol, vlb.coef,
                                               vlb.constant);
  } else if (allowBoundChanges && minlb > lb + mipsolver.mipdata_->epsilon) {
    mipsolver.mipdata_->domain.changeBound(HighsBoundType::kLower, col,
                                           static_cast<double>(minlb),
                                           HighsDomain::Reason::unspecified());
    infeasible = mipsolver.mipdata_->domain.infeasible();
  }
}